

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase330::run(TestCase330 *this)

{
  PromiseNode *pPVar1;
  PromiseFulfiller<void> *pPVar2;
  Disposer *pDVar3;
  int iVar4;
  ssize_t sVar5;
  Promise<void> promise1;
  Promise<void> promise2;
  WaitScope waitScope;
  int pipefds2 [2];
  int pipefds [2];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:346:3)>
  _kjDefer346;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_unix_test_c__:338:3)>
  _kjDefer338;
  FdObserver observer2;
  FdObserver observer;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_3a8 [8];
  PromiseNode *local_3a0;
  undefined1 local_398 [8];
  PromiseFulfiller<void> *local_390;
  WaitScope local_388;
  Disposer local_378;
  Disposer local_370;
  Disposer *local_368;
  undefined1 local_360;
  Disposer *local_358;
  undefined1 local_350;
  FdObserver local_348;
  FdObserver local_2f0;
  NullableValue<kj::Exception> local_298;
  char local_138;
  EventLoop local_128;
  UnixEventPort local_f0;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&local_f0);
  EventLoop::EventLoop(&local_128,&local_f0.super_EventPort);
  local_388.busyPollInterval = 0xffffffff;
  local_388.loop = &local_128;
  EventLoop::enterScope(&local_128);
  do {
    iVar4 = ::pipe((int *)&local_370);
    if (-1 < iVar4) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_2f0.eventPort = (UnixEventPort *)0x0;
    local_298.isSet = false;
    local_298._1_7_ = 0;
    local_298.field_1.value.ownFile.content.ptr = (char *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_2f0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_2f0);
  }
  local_350 = 0;
  local_358 = &local_370;
  UnixEventPort::FdObserver::FdObserver(&local_2f0,&local_f0,(int)local_370._vptr_Disposer,1);
  do {
    sVar5 = ::write(local_370._vptr_Disposer._4_4_,"foo",3);
    if (-1 < sVar5) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_348.eventPort = (UnixEventPort *)0x0;
    local_298.isSet = false;
    local_298._1_7_ = 0;
    local_298.field_1.value.ownFile.content.ptr = (char *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_348,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_348);
  }
  do {
    iVar4 = ::pipe((int *)&local_378);
    if (-1 < iVar4) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_348.eventPort = (UnixEventPort *)0x0;
    local_298.isSet = false;
    local_298._1_7_ = 0;
    local_298.field_1.value.ownFile.content.ptr = (char *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_348,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_348);
  }
  local_360 = 0;
  local_368 = &local_378;
  UnixEventPort::FdObserver::FdObserver(&local_348,&local_f0,(int)local_378._vptr_Disposer,1);
  do {
    sVar5 = ::write(local_378._vptr_Disposer._4_4_,"bar",3);
    if (-1 < sVar5) {
      iVar4 = 0;
      break;
    }
    iVar4 = _::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_3a8 = (undefined1  [8])0x0;
    local_298.isSet = false;
    local_298._1_7_ = 0;
    local_298.field_1.value.ownFile.content.ptr = (char *)0x0;
    _::Debug::Fault::init
              ((Fault *)local_3a8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)local_3a8);
  }
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_3a8);
  UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_398);
  local_298._0_8_ = local_298._0_8_ & 0xffffffffffffff00;
  local_138 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)local_3a8,(ExceptionOrValue *)&local_298,&local_388);
  if (local_138 == '\x01') {
    if (local_298.isSet != false) {
      throwRecoverableException(&local_298.field_1.value,0);
    }
  }
  else {
    if (local_298.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_298.field_1.value,0);
  }
  if (local_298.isSet == true) {
    Exception::~Exception(&local_298.field_1.value);
  }
  local_298._0_8_ = local_298._0_8_ & 0xffffffffffffff00;
  local_138 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)local_398,(ExceptionOrValue *)&local_298,&local_388);
  if (local_138 == '\x01') {
    if (local_298.isSet != false) {
      throwRecoverableException(&local_298.field_1.value,0);
    }
  }
  else {
    if (local_298.isSet == false) {
      _::unreachable();
    }
    throwRecoverableException(&local_298.field_1.value,0);
  }
  if (local_298.isSet == true) {
    Exception::~Exception(&local_298.field_1.value);
  }
  pPVar2 = local_390;
  if (local_390 != (PromiseFulfiller<void> *)0x0) {
    local_390 = (PromiseFulfiller<void> *)0x0;
    (**((EventPort *)local_398)->_vptr_EventPort)
              (local_398,pPVar2->_vptr_PromiseFulfiller[-2] + (long)&pPVar2->_vptr_PromiseFulfiller)
    ;
  }
  pPVar1 = local_3a0;
  if (local_3a0 != (PromiseNode *)0x0) {
    local_3a0 = (PromiseNode *)0x0;
    (**(_func_int **)(((String *)local_3a8)->content).ptr)
              (local_3a8,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  UnixEventPort::FdObserver::~FdObserver(&local_348);
  pDVar3 = local_368;
  close(*(int *)((long)&local_368->_vptr_Disposer + 4));
  close(*(int *)&pDVar3->_vptr_Disposer);
  UnixEventPort::FdObserver::~FdObserver(&local_2f0);
  pDVar3 = local_358;
  close(*(int *)((long)&local_358->_vptr_Disposer + 4));
  close(*(int *)&pDVar3->_vptr_Disposer);
  EventLoop::leaveScope(local_388.loop);
  EventLoop::~EventLoop(&local_128);
  UnixEventPort::~UnixEventPort(&local_f0);
  return;
}

Assistant:

TEST(AsyncUnixTest, ReadObserverMultiReceive) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  KJ_DEFER({ close(pipefds[1]); close(pipefds[0]); });

  UnixEventPort::FdObserver observer(port, pipefds[0],
      UnixEventPort::FdObserver::OBSERVE_READ);
  KJ_SYSCALL(write(pipefds[1], "foo", 3));

  int pipefds2[2];
  KJ_SYSCALL(pipe(pipefds2));
  KJ_DEFER({ close(pipefds2[1]); close(pipefds2[0]); });

  UnixEventPort::FdObserver observer2(port, pipefds2[0],
      UnixEventPort::FdObserver::OBSERVE_READ);
  KJ_SYSCALL(write(pipefds2[1], "bar", 3));

  auto promise1 = observer.whenBecomesReadable();
  auto promise2 = observer2.whenBecomesReadable();
  promise1.wait(waitScope);
  promise2.wait(waitScope);
}